

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_term_indexer.cc
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
S2RegionTermIndexer::GetIndexTerms_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,S2RegionTermIndexer *this,S2Point *point,string_view prefix)

{
  int level;
  S2CellId id;
  S2CellId local_60;
  S2CellId local_58;
  string local_50;
  
  S2CellId::S2CellId(&local_58,point);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  level = (this->options_).super_Options.min_level_;
  if (level <= (this->options_).super_Options.max_level_) {
    do {
      local_60 = S2CellId::parent(&local_58,level);
      GetTerm_abi_cxx11_(&local_50,this,ANCESTOR,&local_60,prefix);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      level = level + (this->options_).super_Options.level_mod_;
    } while (level <= (this->options_).super_Options.max_level_);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> S2RegionTermIndexer::GetIndexTerms(const S2Point& point,
                                                  string_view prefix) {
  // See the top of this file for an overview of the indexing strategy.
  //
  // The last cell generated by this loop is effectively the covering for
  // the given point.  You might expect that this cell would be indexed as a
  // covering term, but as an optimization we always index these cells as
  // ancestor terms only.  This is possible because query regions will never
  // contain a descendant of such cells.  Note that this is true even when
  // max_level() != true_max_level() (see S2RegionCoverer::Options).

  const S2CellId id(point);
  vector<string> terms;
  for (int level = options_.min_level(); level <= options_.max_level();
       level += options_.level_mod()) {
    terms.push_back(GetTerm(TermType::ANCESTOR, id.parent(level), prefix));
  }
  return terms;
}